

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
AttachmentPromiseNode
          (AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
           *this,OwnPromiseNode *dependency,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachment)

{
  undefined8 uVar1;
  
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (&this->super_AttachmentPromiseNodeBase,dependency);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00642858;
  (this->attachment).tag = attachment->tag;
  if (attachment->tag == 2) {
    *(undefined8 *)((long)&(this->attachment).field_1 + 0x10) =
         *(undefined8 *)((long)&attachment->field_1 + 0x10);
    uVar1 = *(undefined8 *)((long)&attachment->field_1 + 8);
    *(undefined8 *)&(this->attachment).field_1 = *(undefined8 *)&attachment->field_1;
    *(undefined8 *)((long)&(this->attachment).field_1 + 8) = uVar1;
  }
  else if (attachment->tag == 1) {
    *(undefined8 *)&(this->attachment).field_1 = *(undefined8 *)&attachment->field_1;
    *(undefined8 *)((long)&(this->attachment).field_1 + 8) =
         *(undefined8 *)((long)&attachment->field_1 + 8);
    *(undefined8 *)((long)&(this->attachment).field_1 + 0x10) =
         *(undefined8 *)((long)&attachment->field_1 + 0x10);
    *(undefined8 *)&attachment->field_1 = 0;
    *(undefined8 *)((long)&attachment->field_1 + 8) = 0;
  }
  return;
}

Assistant:

AttachmentPromiseNode(OwnPromiseNode&& dependency, Attachment&& attachment)
      : AttachmentPromiseNodeBase(kj::mv(dependency)),
        attachment(kj::mv<Attachment>(attachment)) {}